

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-type.cpp
# Opt level: O3

void __thiscall
wasm::anon_unknown_0::HeapTypeChildCollector::~HeapTypeChildCollector(HeapTypeChildCollector *this)

{
  pointer pHVar1;
  void *pvVar2;
  
  pHVar1 = (this->children).super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (pHVar1 != (pointer)0x0) {
    operator_delete(pHVar1,(long)(this->children).
                                 super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pHVar1);
  }
  pvVar2 = (this->super_HeapTypeChildWalker<wasm::(anonymous_namespace)::HeapTypeChildCollector>).
           super_TypeGraphWalkerBase<wasm::(anonymous_namespace)::HeapTypeChildCollector>.taskList.
           super__Vector_base<wasm::(anonymous_namespace)::TypeGraphWalkerBase<wasm::(anonymous_namespace)::HeapTypeChildCollector>::Task,_std::allocator<wasm::(anonymous_namespace)::TypeGraphWalkerBase<wasm::(anonymous_namespace)::HeapTypeChildCollector>::Task>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pvVar2 != (void *)0x0) {
    operator_delete(pvVar2,(long)(this->
                                 super_HeapTypeChildWalker<wasm::(anonymous_namespace)::HeapTypeChildCollector>
                                 ).
                                 super_TypeGraphWalkerBase<wasm::(anonymous_namespace)::HeapTypeChildCollector>
                                 .taskList.
                                 super__Vector_base<wasm::(anonymous_namespace)::TypeGraphWalkerBase<wasm::(anonymous_namespace)::HeapTypeChildCollector>::Task,_std::allocator<wasm::(anonymous_namespace)::TypeGraphWalkerBase<wasm::(anonymous_namespace)::HeapTypeChildCollector>::Task>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pvVar2);
    return;
  }
  return;
}

Assistant:

void noteChild(HeapType type) { children.push_back(type); }